

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

Serializer * __thiscall cfd::core::Serializer::operator<<(Serializer *this,int64_t number)

{
  CheckNeedSize(this,8);
  *(int64_t *)
   ((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + this->offset_) = number;
  this->offset_ = this->offset_ + 8;
  return this;
}

Assistant:

Serializer& Serializer::operator<<(int64_t number) {
  AddDirectNumber(number);
  return *this;
}